

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath1.0.c
# Opt level: O0

LY_ERR lyplg_type_xpath10_print_token
                 (char *token,uint16_t tok_len,ly_bool is_nametest,lys_module **context_mod,
                 ly_ctx *resolve_ctx,LY_VALUE_FORMAT resolve_format,void *resolve_prefix_data,
                 LY_VALUE_FORMAT get_format,void *get_prefix_data,char **token_p,ly_err_item **err)

{
  void *__ptr;
  int iVar1;
  size_t sVar2;
  lys_module *mod_00;
  lys_module *mod;
  uint local_68;
  uint32_t pref_len;
  uint32_t str_len;
  uint32_t len;
  void *mem;
  char *str;
  ly_bool has_prefix;
  char *pcStack_48;
  ly_bool is_prefix;
  char *prefix;
  char *str_next;
  char *str_begin;
  LY_ERR ret;
  LY_VALUE_FORMAT resolve_format_local;
  ly_ctx *resolve_ctx_local;
  lys_module **context_mod_local;
  ly_bool is_nametest_local;
  char *pcStack_10;
  uint16_t tok_len_local;
  char *token_local;
  
  str_begin._0_4_ = LY_SUCCESS;
  str._6_1_ = '\0';
  mem = (void *)0x0;
  local_68 = 0;
  str_next = token;
  str_begin._4_4_ = resolve_format;
  _ret = resolve_ctx;
  resolve_ctx_local = (ly_ctx *)context_mod;
  context_mod_local._5_1_ = is_nametest;
  context_mod_local._6_2_ = tok_len;
  pcStack_10 = token;
  do {
    str_begin._0_4_ =
         ly_value_prefix_next
                   (str_next,pcStack_10 + (int)(uint)context_mod_local._6_2_,&pref_len,
                    (ly_bool *)((long)&str + 7),&prefix);
    if ((LY_ERR)str_begin != LY_SUCCESS || pref_len == 0) {
LAB_0023c562:
      if ((LY_ERR)str_begin == LY_SUCCESS) {
        *token_p = (char *)mem;
      }
      else {
        free(mem);
      }
      return (LY_ERR)str_begin;
    }
    if (str._7_1_ == '\0') {
      if (((str._6_1_ == '\0') && (context_mod_local._5_1_ != '\0')) &&
         ((get_format == LY_VALUE_XML && ((resolve_ctx_local->dict).hash_tab != (ly_ht *)0x0)))) {
        pcStack_48 = lyplg_type_get_prefix
                               ((lys_module *)(resolve_ctx_local->dict).hash_tab,LY_VALUE_XML,
                                get_prefix_data);
        __ptr = mem;
        if (pcStack_48 == (char *)0x0) {
          __assert_fail("prefix",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                        ,0x3c,
                        "LY_ERR lyplg_type_xpath10_print_token(const char *, uint16_t, ly_bool, const struct lys_module **, const struct ly_ctx *, LY_VALUE_FORMAT, const void *, LY_VALUE_FORMAT, void *, char **, struct ly_err_item **)"
                       );
        }
        sVar2 = strlen(pcStack_48);
        _str_len = realloc(__ptr,local_68 + sVar2 + (ulong)pref_len + 2);
        if (_str_len == (void *)0x0) {
          str_begin._0_4_ = ly_err_new(err,LY_EMEM,LYVE_DATA,(char *)0x0,(char *)0x0,"No memory.");
          goto LAB_0023c562;
        }
        mem = _str_len;
        iVar1 = sprintf((char *)((long)_str_len + (ulong)local_68),"%s:%.*s",pcStack_48,
                        (ulong)pref_len,str_next);
      }
      else {
        _str_len = realloc(mem,(ulong)(local_68 + pref_len + 1));
        if (_str_len == (void *)0x0) {
          str_begin._0_4_ = ly_err_new(err,LY_EMEM,LYVE_DATA,(char *)0x0,(char *)0x0,"No memory.");
          goto LAB_0023c562;
        }
        mem = _str_len;
        iVar1 = sprintf((char *)((long)_str_len + (ulong)local_68),"%.*s",(ulong)pref_len,str_next);
      }
      local_68 = iVar1 + local_68;
    }
    else {
      str._6_1_ = '\x01';
      mod_00 = lyplg_type_identity_module
                         (_ret,(lysc_node *)0x0,str_next,(ulong)pref_len,str_begin._4_4_,
                          resolve_prefix_data);
      if ((mod_00 == (lys_module *)0x0) && (context_mod_local._5_1_ != '\0')) {
        str_begin._0_4_ =
             ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                        "Failed to resolve prefix \"%.*s\".",pref_len,str_next);
        goto LAB_0023c562;
      }
      if ((context_mod_local._5_1_ == '\0') ||
         (((get_format != LY_VALUE_JSON && (get_format != LY_VALUE_LYB)) ||
          ((lys_module *)(resolve_ctx_local->dict).hash_tab != mod_00)))) {
        if (mod_00 == (lys_module *)0x0) {
          pcStack_48 = str_next;
          mod._4_4_ = pref_len;
        }
        else {
          pcStack_48 = lyplg_type_get_prefix(mod_00,get_format,get_prefix_data);
          if (pcStack_48 == (char *)0x0) {
            __assert_fail("prefix",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                          ,0x5d,
                          "LY_ERR lyplg_type_xpath10_print_token(const char *, uint16_t, ly_bool, const struct lys_module **, const struct ly_ctx *, LY_VALUE_FORMAT, const void *, LY_VALUE_FORMAT, void *, char **, struct ly_err_item **)"
                         );
          }
          sVar2 = strlen(pcStack_48);
          mod._4_4_ = (uint)sVar2;
        }
        _str_len = realloc(mem,(ulong)(local_68 + mod._4_4_ + 2));
        if (_str_len == (void *)0x0) {
          str_begin._0_4_ = ly_err_new(err,LY_EMEM,LYVE_DATA,(char *)0x0,(char *)0x0,"No memory.");
          goto LAB_0023c562;
        }
        mem = _str_len;
        iVar1 = sprintf((char *)((long)_str_len + (ulong)local_68),"%.*s:",(ulong)mod._4_4_,
                        pcStack_48);
        local_68 = iVar1 + local_68;
      }
      if (context_mod_local._5_1_ != '\0') {
        (resolve_ctx_local->dict).hash_tab = (ly_ht *)mod_00;
      }
    }
    str_next = prefix;
  } while( true );
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_xpath10_print_token(const char *token, uint16_t tok_len, ly_bool is_nametest, const struct lys_module **context_mod,
        const struct ly_ctx *resolve_ctx, LY_VALUE_FORMAT resolve_format, const void *resolve_prefix_data,
        LY_VALUE_FORMAT get_format, void *get_prefix_data, char **token_p, struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    const char *str_begin, *str_next, *prefix;
    ly_bool is_prefix, has_prefix = 0;
    char *str = NULL;
    void *mem;
    uint32_t len, str_len = 0, pref_len;
    const struct lys_module *mod;

    str_begin = token;

    while (!(ret = ly_value_prefix_next(str_begin, token + tok_len, &len, &is_prefix, &str_next)) && len) {
        if (!is_prefix) {
            if (!has_prefix && is_nametest && (get_format == LY_VALUE_XML) && *context_mod) {
                /* get the prefix */
                prefix = lyplg_type_get_prefix(*context_mod, get_format, get_prefix_data);
                assert(prefix);

                /* append the nametest and prefix */
                mem = realloc(str, str_len + strlen(prefix) + 1 + len + 1);
                LY_CHECK_ERR_GOTO(!mem, ret = ly_err_new(err, LY_EMEM, LYVE_DATA, NULL, NULL, "No memory."), cleanup);
                str = mem;
                str_len += sprintf(str + str_len, "%s:%.*s", prefix, (int)len, str_begin);
            } else {
                /* just append the string, we may get the first expression node without a prefix but since this
                 * is not strictly forbidden, allow it */
                mem = realloc(str, str_len + len + 1);
                LY_CHECK_ERR_GOTO(!mem, ret = ly_err_new(err, LY_EMEM, LYVE_DATA, NULL, NULL, "No memory."), cleanup);
                str = mem;
                str_len += sprintf(str + str_len, "%.*s", (int)len, str_begin);
            }
        } else {
            /* remember there was a prefix found */
            has_prefix = 1;

            /* resolve the module in the original format */
            mod = lyplg_type_identity_module(resolve_ctx, NULL, str_begin, len, resolve_format, resolve_prefix_data);
            if (!mod && is_nametest) {
                ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Failed to resolve prefix \"%.*s\".",
                        (int)len, str_begin);
                goto cleanup;
            }

            if (is_nametest && ((get_format == LY_VALUE_JSON) || (get_format == LY_VALUE_LYB)) && (*context_mod == mod)) {
                /* inherit the prefix and do not print it again */
            } else {
                if (mod) {
                    /* get the prefix in the target format */
                    prefix = lyplg_type_get_prefix(mod, get_format, get_prefix_data);
                    assert(prefix);
                    pref_len = strlen(prefix);
                } else {
                    /* invalid prefix, just copy it */
                    prefix = str_begin;
                    pref_len = len;
                }

                /* append the prefix */
                mem = realloc(str, str_len + pref_len + 2);
                LY_CHECK_ERR_GOTO(!mem, ret = ly_err_new(err, LY_EMEM, LYVE_DATA, NULL, NULL, "No memory."), cleanup);
                str = mem;
                str_len += sprintf(str + str_len, "%.*s:", (int)pref_len, prefix);
            }

            if (is_nametest) {
                /* update context module */
                *context_mod = mod;
            }
        }

        str_begin = str_next;
    }

cleanup:
    if (ret) {
        free(str);
    } else {
        *token_p = str;
    }
    return ret;
}